

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

int need_value(FuncState *fs,int list)

{
  Instruction *pIVar1;
  
  while( true ) {
    if (list == -1) {
      return 0;
    }
    pIVar1 = getjumpcontrol(fs,list);
    if ((char)*pIVar1 != '#') break;
    list = getjump(fs,list);
  }
  return 1;
}

Assistant:

static int need_value (FuncState *fs, int list) {
  for (; list != NO_JUMP; list = getjump(fs, list)) {
    Instruction i = *getjumpcontrol(fs, list);
    if (GET_OPCODE(i) != OP_TESTSET) return 1;
  }
  return 0;  /* not found */
}